

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.h
# Opt level: O1

void rengine::animation_rotateZ(AnimationManager *manager,TransformNode *node,float duration)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  float *pfVar1;
  Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
  *this_00;
  shared_ptr<rengine::AbstractAnimation> local_38;
  float local_24;
  
  local_24 = duration;
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00138c08;
  this[1]._M_use_count = 0;
  this[1]._M_weak_count = 0;
  *(undefined4 *)&this[2]._vptr__Sp_counted_base = 1;
  this[2]._M_use_count = 0;
  this[2]._M_weak_count = 0x3ff00000;
  *(byte *)&this[3]._vptr__Sp_counted_base = *(byte *)&this[3]._vptr__Sp_counted_base & 0xf8;
  this[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Animation_00138c58;
  *(TransformNode **)&this[3]._M_use_count = node;
  this[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this[4]._M_use_count = 0;
  this[4]._M_weak_count = 0;
  this[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_00 = (Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
             *)(this + 1);
  *(double *)&this[2]._M_use_count = (double)local_24;
  *(undefined4 *)&this[2]._vptr__Sp_counted_base = 0xffffffff;
  pfVar1 = Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
           ::newKeyFrame(this_00,0.0);
  *pfVar1 = 0.0;
  pfVar1 = Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
           ::newKeyFrame(this_00,1.0);
  *pfVar1 = 6.2831855;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = this->_M_use_count + 1;
  }
  local_38.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  local_38.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = this;
  AnimationManager::start(manager,&local_38,0.0);
  if (local_38.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<rengine::AbstractAnimation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  return;
}

Assistant:

inline void animation_rotateZ(AnimationManager *manager, TransformNode *node, float duration)
{
    auto anim = std::make_shared<Animation_aroundZ_linear>(node);
    anim->setDuration(duration);
    anim->setIterations(-1);
    anim->newKeyFrame(0) = 0;
    anim->newKeyFrame(1) = M_PI * 2;
    manager->start(anim);
}